

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O1

void build_staircase_rooms(chunk *c,char *label)

{
  undefined1 (*pauVar1) [16];
  undefined8 *puVar2;
  room_profile *prVar3;
  undefined8 uVar4;
  connector *pcVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  room_profile profile_00;
  undefined1 auVar10 [16];
  dun_data *pdVar11;
  _Bool _Var12;
  int iVar13;
  long lVar14;
  char *title;
  long lVar15;
  room_profile profile;
  
  pdVar11 = dun;
  lVar14 = (long)dun->profile->n_room_profiles;
  if (0 < lVar14) {
    lVar15 = 0;
    do {
      prVar3 = pdVar11->profile->room_profiles;
      pauVar1 = (undefined1 (*) [16])((long)&prVar3->next + lVar15);
      auVar10 = *pauVar1;
      puVar2 = (undefined8 *)((long)&prVar3->builder + lVar15);
      uVar6 = *puVar2;
      uVar7 = puVar2[1];
      puVar2 = (undefined8 *)((long)&prVar3->width + lVar15);
      uVar8 = *puVar2;
      uVar9 = puVar2[1];
      uVar4 = *(undefined8 *)((long)&prVar3->cutoff + lVar15);
      iVar13 = strcmp(*(char **)(*pauVar1 + 8),"staircase room");
      if (iVar13 == 0) {
        pcVar5 = pdVar11->join;
        pdVar11 = dun;
        for (; pcVar5 != (connector *)0x0; pcVar5 = pcVar5->next) {
          dun = pdVar11;
          pdVar11->curr_join = pcVar5;
          profile_00.builder = (room_builder)uVar6;
          profile_00._0_16_ = auVar10;
          profile_00._24_8_ = uVar7;
          profile_00._32_8_ = uVar8;
          profile_00._40_8_ = uVar9;
          profile_00._48_8_ = uVar4;
          _Var12 = room_build(c,((pcVar5->grid).y + -1) / pdVar11->block_hgt,
                              ((pcVar5->grid).x + -1) / pdVar11->block_wid,profile_00,true);
          if (!_Var12) {
            title = format("%s:  Failed to Build Staircase Room at Row=%d Column=%d in a Cave with %d Rows and %d Columns"
                           ,label,(ulong)(uint)(pcVar5->grid).y,(ulong)(uint)(pcVar5->grid).x,
                           (ulong)(uint)c->height,(ulong)(uint)c->width);
            dump_level_simple((char *)0x0,title,(chunk_conflict *)c);
            quit("Failed to place stairs");
          }
          dun->nstair_room = dun->nstair_room + L'\x01';
          pdVar11 = dun;
        }
        dun = pdVar11;
        return;
      }
      lVar15 = lVar15 + 0x38;
    } while (lVar14 * 0x38 - lVar15 != 0);
  }
  __assert_fail("i < num_rooms",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-cave.c"
                ,0x39e,"void build_staircase_rooms(struct chunk *, const char *)");
}

Assistant:

static void build_staircase_rooms(struct chunk *c, const char *label)
{
	int num_rooms = dun->profile->n_room_profiles;
	struct room_profile profile;
	struct connector *join;
	int i;

	for (i = 0; i < num_rooms; i++) {
		profile = dun->profile->room_profiles[i];
		if (streq(profile.name, "staircase room")) {
			break;
		}
	}
	assert(i < num_rooms);
	for (join = dun->join; join; join = join->next) {
		dun->curr_join = join;
		if (!room_build(c, (join->grid.y - 1) / dun->block_hgt,
				(join->grid.x - 1) / dun->block_wid,
				profile, true)) {
			dump_level_simple(NULL, format("%s:  Failed to Build "
				"Staircase Room at Row=%d Column=%d in a "
				"Cave with %d Rows and %d Columns", label,
				join->grid.y, join->grid.x, c->height,
				c->width), c);
			quit("Failed to place stairs");
		}
		++dun->nstair_room;
	}
}